

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_address_tests.cpp
# Opt level: O1

void __thiscall
IpAddressTests_ToFromLong_Test::~IpAddressTests_ToFromLong_Test
          (IpAddressTests_ToFromLong_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(IpAddressTests, ToFromLong)
{
    ip::address addr = { 192, 1, 1, 11 };
    auto value = ip::to_uint32(addr);
    ASSERT_EQ(value, 3221291275);

    ip::address test_addr(value);

    for(auto i = 0; i < 4; i++)
    {
        EXPECT_EQ(addr[i], test_addr[i]);
    }
}